

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O3

void __thiscall
duckdb::RenameTableInfo::RenameTableInfo
          (RenameTableInfo *this,AlterEntryData *data,string *new_name_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  undefined8 uVar6;
  AlterEntryData local_98;
  
  paVar2 = &local_98.catalog.field_2;
  local_98.catalog._M_dataplus._M_p = (data->catalog)._M_dataplus._M_p;
  paVar1 = &(data->catalog).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.catalog._M_dataplus._M_p == paVar1) {
    local_98.catalog.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_98.catalog.field_2._8_8_ = *(undefined8 *)((long)&(data->catalog).field_2 + 8);
    local_98.catalog._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_98.catalog.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_98.catalog._M_string_length = (data->catalog)._M_string_length;
  paVar3 = &local_98.schema.field_2;
  (data->catalog)._M_dataplus._M_p = (pointer)paVar1;
  (data->catalog)._M_string_length = 0;
  (data->catalog).field_2._M_local_buf[0] = '\0';
  local_98.schema._M_dataplus._M_p = (data->schema)._M_dataplus._M_p;
  paVar1 = &(data->schema).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.schema._M_dataplus._M_p == paVar1) {
    local_98.schema.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_98.schema.field_2._8_8_ = *(undefined8 *)((long)&(data->schema).field_2 + 8);
    local_98.schema._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_98.schema.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_98.schema._M_string_length = (data->schema)._M_string_length;
  paVar4 = &local_98.name.field_2;
  (data->schema)._M_dataplus._M_p = (pointer)paVar1;
  (data->schema)._M_string_length = 0;
  (data->schema).field_2._M_local_buf[0] = '\0';
  local_98.name._M_dataplus._M_p = (data->name)._M_dataplus._M_p;
  paVar1 = &(data->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.name._M_dataplus._M_p == paVar1) {
    local_98.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_98.name.field_2._8_8_ = *(undefined8 *)((long)&(data->name).field_2 + 8);
    local_98.name._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_98.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_98.name._M_string_length = (data->name)._M_string_length;
  (data->name)._M_dataplus._M_p = (pointer)paVar1;
  (data->name)._M_string_length = 0;
  (data->name).field_2._M_local_buf[0] = '\0';
  local_98.if_not_found = data->if_not_found;
  AlterTableInfo::AlterTableInfo(&this->super_AlterTableInfo,RENAME_TABLE,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.name._M_dataplus._M_p != paVar4) {
    operator_delete(local_98.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.schema._M_dataplus._M_p != paVar3) {
    operator_delete(local_98.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.catalog._M_dataplus._M_p != paVar2) {
    operator_delete(local_98.catalog._M_dataplus._M_p);
  }
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__RenameTableInfo_01980ca0;
  paVar2 = &(this->new_table_name).field_2;
  (this->new_table_name)._M_dataplus._M_p = (pointer)paVar2;
  pcVar5 = (new_name_p->_M_dataplus)._M_p;
  paVar1 = &new_name_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar1) {
    uVar6 = *(undefined8 *)((long)&new_name_p->field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->new_table_name).field_2 + 8) = uVar6;
  }
  else {
    (this->new_table_name)._M_dataplus._M_p = pcVar5;
    (this->new_table_name).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->new_table_name)._M_string_length = new_name_p->_M_string_length;
  (new_name_p->_M_dataplus)._M_p = (pointer)paVar1;
  new_name_p->_M_string_length = 0;
  (new_name_p->field_2)._M_local_buf[0] = '\0';
  return;
}

Assistant:

RenameTableInfo::RenameTableInfo(AlterEntryData data, string new_name_p)
    : AlterTableInfo(AlterTableType::RENAME_TABLE, std::move(data)), new_table_name(std::move(new_name_p)) {
}